

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IgnoreErrorsCMP0061(cmMakefile *this)

{
  PolicyStatus PVar1;
  bool local_11;
  bool ignoreErrors;
  cmMakefile *this_local;
  
  local_11 = true;
  PVar1 = GetPolicyStatus(this,CMP0061,false);
  if (((PVar1 != OLD) && (PVar1 != WARN)) && (PVar1 - NEW < 3)) {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool cmMakefile::IgnoreErrorsCMP0061() const
{
  bool ignoreErrors = true;
  switch (this->GetPolicyStatus(cmPolicies::CMP0061)) {
    case cmPolicies::WARN:
      // No warning for this policy!
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      ignoreErrors = false;
      break;
  }
  return ignoreErrors;
}